

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

appender fmt::v8::detail::
         do_write_float<fmt::v8::appender,fmt::v8::detail::big_decimal_fp,char,fmt::v8::detail::digit_grouping<char>>
                   (appender out,big_decimal_fp *fp,basic_format_specs<char> *specs,
                   float_specs fspecs,locale_ref loc)

{
  char cVar1;
  float_specs fVar2;
  byte bVar3;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> bVar4;
  appender aVar5;
  byte *pbVar6;
  byte *pbVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  size_t sVar13;
  ulong uVar14;
  char decimal_point;
  char zero;
  bool pointy;
  int significand_size;
  sign_t sign;
  char *significand;
  int exp;
  anon_class_40_8_dbbf3351 write;
  int num_zeros;
  undefined1 local_ca [2];
  uint local_c8;
  int local_c4;
  undefined1 local_c0 [12];
  sign_t local_b4;
  undefined1 local_b0 [24];
  char **local_98;
  undefined8 local_90;
  undefined1 local_88 [5];
  char cStack_83;
  undefined2 uStack_82;
  digit_grouping<char> *local_80;
  digit_grouping<char> *local_78;
  int *local_70;
  int *local_68;
  char *local_60;
  digit_grouping<char> local_58;
  
  local_b0._0_8_ = fp->significand;
  local_c4 = fp->significand_size;
  local_ca[1] = 0x30;
  local_c0._4_4_ = fspecs._4_4_;
  local_b4 = (uint)local_c0._4_4_ >> 8 & 0xff;
  fVar2 = fspecs;
  if (local_c4 < 0) goto LAB_0011bff6;
  uVar14 = (ulong)((local_c4 + 1) - (uint)(local_b4 == none));
  local_ca[0] = '.';
  uVar10 = (uint)local_c0._4_4_ >> 0x11;
  local_c0._0_8_ = fspecs;
  if ((uVar10 & 1) != 0) {
    local_ca[0] = decimal_point_impl<char>(loc);
  }
  uVar10 = fp->exponent;
  local_b0._12_4_ = local_c4 + uVar10;
  if (SUB81(local_c0._0_8_,4) == '\x01') {
LAB_0011bcbe:
    iVar9 = local_c4 + uVar10 + -1;
    if (((uint)local_c0._4_4_ >> 0x14 & 1) == 0) {
      uVar8 = 0;
      if (local_c4 == 1) {
        local_ca[0] = '\0';
      }
    }
    else {
      uVar8 = 0;
      if (0 < local_c0._0_4_ - local_c4) {
        uVar8 = (ulong)(uint)(local_c0._0_4_ - local_c4);
      }
      uVar14 = uVar14 + uVar8;
    }
    local_b0._16_4_ = local_b4;
    local_98 = (char **)local_b0._0_8_;
    local_90._0_5_ = CONCAT14(local_ca[0],local_c4);
    local_88 = (undefined1  [5])CONCAT14('0',(int)uVar8);
    _local_88 = (big_decimal_fp *)
                (CONCAT26(uStack_82,
                          CONCAT15((((uint)local_c0._4_4_ >> 0x10 & 1) == 0) << 5,local_88)) |
                0x450000000000);
    local_80 = (digit_grouping<char> *)CONCAT44(local_80._4_4_,iVar9);
    if (specs->width < 1) {
      if ((ulong)local_b4 != 0) {
        cVar1 = ""[local_b4];
        if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                             container + 0x18) <
            *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container
                     + 0x10) + 1U) {
          (*(code *)**(undefined8 **)
                      out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container)
                    (out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
        }
        lVar12 = *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                                 container + 0x10);
        *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                 0x10) = lVar12 + 1;
        *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                                  container + 8) + lVar12) = cVar1;
      }
      bVar4.container =
           (buffer<char> *)
           write_significand<fmt::v8::appender,char>
                     (out,(char *)local_98,(int)local_90,1,local_90._4_1_);
      if (0 < (int)local_88._0_4_) {
        bVar4.container =
             (buffer<char> *)
             fill_n<fmt::v8::appender,int,char>
                       ((appender)bVar4.container,local_88._0_4_,(char *)((long)local_88 + 4));
      }
      cVar1 = cStack_83;
      if ((bVar4.container)->capacity_ < (bVar4.container)->size_ + 1) {
        (**(bVar4.container)->_vptr_buffer)(bVar4.container);
      }
      sVar13 = (bVar4.container)->size_;
      (bVar4.container)->size_ = sVar13 + 1;
      (bVar4.container)->ptr_[sVar13] = cVar1;
      bVar4.container =
           (buffer<char> *)write_exponent<char,fmt::v8::appender>((int)local_80,bVar4.container);
    }
    else {
      if ((int)local_b0._12_4_ < 1) {
        iVar9 = 1 - local_b0._12_4_;
      }
      lVar12 = 2;
      if (99 < iVar9) {
        lVar12 = (ulong)(999 < iVar9) + 3;
      }
      sVar13 = uVar14 + (3 - (ulong)(local_ca[0] == '\0')) + lVar12;
      bVar4.container =
           (buffer<char> *)
           write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::do_write_float<fmt::v8::appender,fmt::v8::detail::big_decimal_fp,char,fmt::v8::detail::digit_grouping<char>>(fmt::v8::appender,fmt::v8::detail::big_decimal_fp_const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_1_&>
                     (out,specs,sVar13,sVar13,(anon_class_40_8_dbbf3351 *)(local_b0 + 0x10));
    }
  }
  else {
    if ((local_c0._0_8_ & 0xff00000000) == 0) {
      iVar9 = 0x10;
      if (0 < (int)local_c0._0_4_) {
        iVar9 = local_c0._0_4_;
      }
      if (((int)local_b0._12_4_ < -3) || (iVar9 < (int)local_b0._12_4_)) goto LAB_0011bcbe;
    }
    if ((int)uVar10 < 0) {
      if ((int)local_b0._12_4_ < 1) {
        iVar9 = -local_b0._12_4_;
        local_58.sep_.grouping._M_dataplus._M_p._0_4_ = iVar9;
        if (SBORROW4(local_c0._0_4_,iVar9) != (int)(local_c0._0_4_ + local_b0._12_4_) < 0) {
          local_58.sep_.grouping._M_dataplus._M_p._0_4_ = local_c0._0_4_;
        }
        if ((int)local_c0._0_4_ < 0) {
          local_58.sep_.grouping._M_dataplus._M_p._0_4_ = iVar9;
        }
        if (local_c4 != 0) {
          local_58.sep_.grouping._M_dataplus._M_p._0_4_ = iVar9;
        }
        bVar3 = 1;
        if (local_c4 == 0 && (int)local_58.sep_.grouping._M_dataplus._M_p == 0) {
          bVar3 = (local_c0[6] & 0x10) >> 4;
        }
        local_c8 = CONCAT31(local_c8._1_3_,bVar3);
        fVar2 = (float_specs)local_c0._0_8_;
        if (-1 < (int)local_58.sep_.grouping._M_dataplus._M_p) {
          sVar13 = ((uint)bVar3 + (int)local_58.sep_.grouping._M_dataplus._M_p + 1) + uVar14;
          local_b0._16_8_ = &local_b4;
          local_98 = (char **)(local_ca + 1);
          local_90 = (bool *)(local_ca + 2);
          _local_88 = (big_decimal_fp *)local_ca;
          local_80 = &local_58;
          local_78 = (digit_grouping<char> *)local_b0;
          local_70 = (int *)(local_ca + 6);
          aVar5 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::do_write_float<fmt::v8::appender,fmt::v8::detail::big_decimal_fp,char,fmt::v8::detail::digit_grouping<char>>(fmt::v8::appender,fmt::v8::detail::big_decimal_fp_const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_4_&>
                            (out,specs,sVar13,sVar13,(anon_class_56_7_162c6e41 *)(local_b0 + 0x10));
          return (back_insert_iterator<fmt::v8::detail::buffer<char>_>)
                 aVar5.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
        }
LAB_0011bff6:
        local_c0._0_8_ = fVar2;
        assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/fmt-src/include/fmt/core.h"
                    ,0x1aa,"negative value");
      }
      uVar10 = local_c0._0_4_ - local_c4 & (int)(local_c0._4_4_ << 0xb) >> 0x1f;
      local_c8 = uVar10;
      digit_grouping<char>::digit_grouping
                (&local_58,loc,(bool)((byte)((uint)local_c0._4_4_ >> 0x11) & 1));
      pbVar6 = (byte *)CONCAT44(local_58.sep_.grouping._M_dataplus._M_p._4_4_,
                                (int)local_58.sep_.grouping._M_dataplus._M_p);
      pbVar7 = pbVar6 + local_58.sep_.grouping._M_string_length;
      iVar9 = 0;
      if ((int)uVar10 < 1) {
        uVar10 = 0;
      }
      sVar13 = uVar10 + uVar14;
      do {
        iVar11 = 0x7fffffff;
        if (local_58.sep_.thousands_sep != '\0') {
          if (pbVar6 == pbVar7) {
            uVar10 = (uint)(char)pbVar7[-1];
          }
          else {
            bVar3 = *pbVar6;
            if ((byte)(bVar3 + 0x81) < 0x82) goto LAB_0011bec8;
            pbVar6 = pbVar6 + 1;
            uVar10 = (uint)bVar3;
          }
          iVar9 = iVar9 + uVar10;
          iVar11 = iVar9;
        }
LAB_0011bec8:
        sVar13 = sVar13 + 1;
      } while (iVar11 < local_c4);
      local_b0._16_8_ = &local_b4;
      local_98 = (char **)local_b0;
      local_90 = (bool *)(local_ca + 6);
      _local_88 = (big_decimal_fp *)(local_b0 + 0xc);
      local_80 = (digit_grouping<char> *)local_ca;
      local_70 = (int *)(local_ca + 2);
      local_68 = (int *)(local_ca + 1);
      local_78 = &local_58;
      bVar4.container =
           (buffer<char> *)
           write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::do_write_float<fmt::v8::appender,fmt::v8::detail::big_decimal_fp,char,fmt::v8::detail::digit_grouping<char>>(fmt::v8::appender,fmt::v8::detail::big_decimal_fp_const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_3_&>
                     (out,specs,sVar13,sVar13,(anon_class_64_8_e6ffa566 *)(local_b0 + 0x10));
    }
    else {
      lVar12 = uVar10 + uVar14;
      local_c8 = local_c0._0_4_ - local_b0._12_4_;
      if (((uint)local_c0._4_4_ >> 0x14 & 1) != 0) {
        if (SUB81(local_c0._0_8_,4) != '\x02' && (int)local_c8 < 1) {
          local_c8 = 1;
        }
        if (0 < (int)local_c8) {
          lVar12 = lVar12 + (ulong)local_c8 + 1;
        }
      }
      digit_grouping<char>::digit_grouping
                (&local_58,loc,(bool)((byte)((uint)local_c0._4_4_ >> 0x11) & 1));
      pbVar6 = (byte *)CONCAT44(local_58.sep_.grouping._M_dataplus._M_p._4_4_,
                                (int)local_58.sep_.grouping._M_dataplus._M_p);
      pbVar7 = pbVar6 + local_58.sep_.grouping._M_string_length;
      sVar13 = lVar12 - 1;
      iVar9 = 0;
      do {
        iVar11 = 0x7fffffff;
        if (local_58.sep_.thousands_sep != '\0') {
          if (pbVar6 == pbVar7) {
            uVar10 = (uint)(char)pbVar7[-1];
          }
          else {
            bVar3 = *pbVar6;
            if ((byte)(bVar3 + 0x81) < 0x82) goto LAB_0011bc55;
            pbVar6 = pbVar6 + 1;
            uVar10 = (uint)bVar3;
          }
          iVar9 = iVar9 + uVar10;
          iVar11 = iVar9;
        }
LAB_0011bc55:
        sVar13 = sVar13 + 1;
      } while (iVar11 < local_c4);
      local_b0._16_8_ = &local_b4;
      local_98 = (char **)local_b0;
      local_90 = (bool *)(local_ca + 6);
      local_78 = (digit_grouping<char> *)(local_ca + 10);
      local_70 = (int *)local_ca;
      local_68 = (int *)(local_ca + 2);
      local_60 = local_ca + 1;
      _local_88 = fp;
      local_80 = &local_58;
      bVar4.container =
           (buffer<char> *)
           write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::do_write_float<fmt::v8::appender,fmt::v8::detail::big_decimal_fp,char,fmt::v8::detail::digit_grouping<char>>(fmt::v8::appender,fmt::v8::detail::big_decimal_fp_const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_2_&>
                     (out,specs,sVar13,sVar13,(anon_class_72_9_d68ba176 *)(local_b0 + 0x10));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_58.sep_.grouping._M_dataplus._M_p._4_4_,
                    (int)local_58.sep_.grouping._M_dataplus._M_p) != &local_58.sep_.grouping.field_2
       ) {
      operator_delete((undefined1 *)
                      CONCAT44(local_58.sep_.grouping._M_dataplus._M_p._4_4_,
                               (int)local_58.sep_.grouping._M_dataplus._M_p));
    }
  }
  return (appender)(back_insert_iterator<fmt::v8::detail::buffer<char>_>)bVar4.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& fp,
                                    const basic_format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  constexpr Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros) + 1;
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   fp.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}